

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

const_iterator * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
::begin(const_iterator *__return_storage_ptr__,
       parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
       *this)

{
  ctrl_t *pcVar1;
  long lVar2;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  *ppVar3;
  EmbeddedIterator EVar4;
  
  EVar4 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
          ::begin((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                   *)this);
  pcVar1 = (this->sets_)._M_elems[0].set_.ctrl_ + (this->sets_)._M_elems[0].set_.capacity_;
  ppVar3 = this;
  if (EVar4.ctrl_ == pcVar1) {
    lVar2 = 0;
    do {
      EVar4 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              ::begin((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                       *)((long)&(this->sets_)._M_elems[1].set_.ctrl_ + lVar2));
      pcVar1 = (ctrl_t *)
               (*(long *)((long)&(this->sets_)._M_elems[1].set_.ctrl_ + lVar2) +
               *(long *)((long)&(this->sets_)._M_elems[1].set_.capacity_ + lVar2));
      if (EVar4.ctrl_ != pcVar1) {
        ppVar3 = (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                  *)((long)&(this->sets_)._M_elems[1].set_.ctrl_ + lVar2);
        break;
      }
      lVar2 = lVar2 + 0x48;
      ppVar3 = (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                *)0x0;
    } while (lVar2 != 0x438);
  }
  (__return_storage_ptr__->iter_).inner_ = (Inner *)ppVar3;
  (__return_storage_ptr__->iter_).inner_end_ = (Inner *)(this + 1);
  (__return_storage_ptr__->iter_).it_ = EVar4;
  (__return_storage_ptr__->iter_).it_end_.ctrl_ = pcVar1;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin()  const { return const_cast<parallel_hash_set *>(this)->begin(); }